

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEmbed.c
# Opt level: O2

void Gia_ManTestDistance(Gia_Man_t *pGia)

{
  abctime aVar1;
  Emb_Man_t *p;
  abctime aVar2;
  int level;
  Emb_Man_t *pEVar3;
  
  aVar1 = Abc_Clock();
  p = Emb_ManStart(pGia);
  pEVar3 = p;
  Emb_ManPrintStats(p);
  level = (int)pEVar3;
  Abc_Print(level,"%s =","Time");
  aVar2 = Abc_Clock();
  Abc_Print(level,"%9.2f sec\n",(double)(aVar2 - aVar1) / 1000000.0);
  Gia_ManTestDistanceInternal(p);
  Emb_ManStop(p);
  return;
}

Assistant:

void Gia_ManTestDistance( Gia_Man_t * pGia )
{
    Emb_Man_t * p;
    abctime clk = Abc_Clock();
    p = Emb_ManStart( pGia );
//    Emb_ManPrintFanio( p );
    Emb_ManPrintStats( p );
ABC_PRT( "Time", Abc_Clock() - clk );
    Gia_ManTestDistanceInternal( p );
    Emb_ManStop( p );
}